

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O0

bool Cipher::loadFreqMapBinary(char *fname,TFreqMap *freqMap)

{
  mapped_type mVar1;
  byte bVar2;
  mapped_type *pmVar3;
  long in_RSI;
  char *in_RDI;
  uint8_t d;
  int i;
  uint8_t n8;
  TProb curp;
  TCode curi;
  int32_t n;
  ifstream fin;
  key_type *in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  mapped_type in_stack_fffffffffffffd94;
  byte local_245;
  int local_244;
  byte local_23d;
  mapped_type local_23c;
  int local_238;
  int local_234 [5];
  char local_220 [520];
  long local_18;
  char *local_10;
  byte local_1;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::ifstream::ifstream(local_220,in_RDI,_S_bin);
  bVar2 = std::ios::good();
  if ((bVar2 & 1) == 0) {
    printf("    Failed to open file \'%s\'\n",local_10);
    local_1 = 0;
  }
  else {
    std::istream::read(local_220,local_18);
    std::istream::read(local_220,local_18 + 8);
    std::istream::read(local_220,local_18 + 0x10);
    std::istream::read(local_220,(long)local_234);
    for (; 0 < local_234[0]; local_234[0] = local_234[0] + -1) {
      std::istream::read(local_220,(long)&local_238);
      std::istream::read(local_220,(long)&local_23c);
      mVar1 = local_23c;
      pmVar3 = std::
               unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
               ::operator[]((unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                             *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                            in_stack_fffffffffffffd88);
      *pmVar3 = mVar1;
      std::istream::read(local_220,(long)&local_23d);
      if (local_23d != 0) {
        for (local_244 = 0; local_244 < (int)(uint)local_23d; local_244 = local_244 + 1) {
          std::istream::read(local_220,(long)&local_245);
          std::istream::read(local_220,(long)&local_23c);
          in_stack_fffffffffffffd94 = local_23c;
          pmVar3 = std::
                   unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                   ::operator[]((unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                                 *)CONCAT44(local_23c,in_stack_fffffffffffffd90),
                                in_stack_fffffffffffffd88);
          *pmVar3 = in_stack_fffffffffffffd94;
          local_238 = (uint)local_245 + local_238;
        }
        local_234[0] = local_234[0] - (uint)local_23d;
      }
    }
    local_1 = 1;
  }
  local_234[1] = 1;
  std::ifstream::~ifstream(local_220);
  return (bool)(local_1 & 1);
}

Assistant:

bool loadFreqMapBinary(const char * fname, TFreqMap & freqMap) {
        std::ifstream fin(fname, std::ios::binary);
        if (fin.good() == false) {
            printf("    Failed to open file '%s'\n", fname);
            return false;
        }

        fin.read((char *) &freqMap.len,    sizeof(freqMap.len));
        fin.read((char *) &freqMap.nTotal, sizeof(freqMap.nTotal));
        fin.read((char *) &freqMap.pmin,   sizeof(freqMap.pmin));

        {
            int32_t n;
            fin.read((char *) &n, sizeof(n));

            TCode curi;
            TProb curp;

            while (n > 0) {
                fin.read((char *) &curi, sizeof(curi));
                fin.read((char *) &curp, sizeof(curp));
                freqMap.prob[curi] = curp;

                uint8_t n8;
                fin.read((char *) &n8, sizeof(n8));

                if (n8 > 0) {
                    for (int i = 0; i < n8; ++i) {
                        uint8_t d;
                        fin.read((char *) &d,    sizeof(d));
                        fin.read((char *) &curp, sizeof(curp));
                        freqMap.prob[curi + d] = curp;
                        curi += d;
                    }

                    n -= n8;
                }

                --n;
            }
        }

        return true;
    }